

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableDefine *table,void *data)

{
  uint uVar1;
  int end_register;
  pointer puVar2;
  SyntaxTree *pSVar3;
  pointer puVar4;
  TableFieldData field_data;
  Guard g;
  uint local_a0 [2];
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  Guard local_50;
  
  uVar1 = *data;
  end_register = *(int *)((long)data + 4);
  if ((int)uVar1 < end_register || end_register == -1) {
    Function::AddInstruction
              (this->current_function_->function_,(Instruction)((uVar1 & 0xff) << 0x10 | 0x23000000)
               ,table->line_);
    puVar4 = (table->fields_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (table->fields_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar4 != puVar2) {
      local_a0[1] = 1;
      local_a0[0] = uVar1;
      for (; puVar4 != puVar2; puVar4 = puVar4 + 1) {
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        local_60 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1532:17)>
                   ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1532:17)>
                   ::_M_manager;
        local_98._12_4_ = 0;
        local_98._8_4_ = this->current_function_->register_id_;
        local_80 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1532:17)>
                   ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1532:17)>
                   ::_M_manager;
        local_98._M_unused._M_object = this;
        Guard::Guard(&local_50,(function<void_()> *)&local_78,(function<void_()> *)&local_98);
        std::_Function_base::~_Function_base((_Function_base *)&local_98);
        std::_Function_base::~_Function_base((_Function_base *)&local_78);
        pSVar3 = (puVar4->_M_t).
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this,local_a0);
        Guard::~Guard(&local_50);
      }
    }
    FillRemainRegisterNil(this,uVar1 + 1,end_register,table->line_);
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableDefine *table, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;

        // No register, then do not generate code
        if (end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        // New table
        auto function = GetCurrentFunction();
        auto instruction = Instruction::ACode(OpType_NewTable, register_id);
        function->AddInstruction(instruction, table->line_);

        if (!table->fields_.empty())
        {
            // Init table value
            TableFieldData field_data{ register_id };
            for (auto &field : table->fields_)
            {
                REGISTER_GENERATOR_GUARD();
                field->Accept(this, &field_data);
            }
        }

        FillRemainRegisterNil(register_id + 1, end_register, table->line_);
    }